

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktImageLoadStoreTests.cpp
# Opt level: O3

MovePtr<vkt::TestCase,_de::DefaultDeleter<vkt::TestCase>_> *
vkt::image::createImageQualifierRestrictCase
          (MovePtr<vkt::TestCase,_de::DefaultDeleter<vkt::TestCase>_> *__return_storage_ptr__,
          TestContext *testCtx,ImageType imageType,string *name)

{
  long lVar1;
  TestCase *this;
  undefined8 *puVar2;
  long *local_50 [2];
  long local_40 [2];
  
  lVar1 = 0;
  puVar2 = &(anonymous_namespace)::s_textures;
  do {
    if (*(ImageType *)((long)&DAT_00d7702c + lVar1) == imageType) {
      puVar2 = (undefined8 *)((long)&(anonymous_namespace)::s_textures + lVar1);
      break;
    }
    lVar1 = lVar1 + 0x18;
  } while (lVar1 != 0xc0);
  this = (TestCase *)operator_new(0x98);
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"");
  tcu::TestCase::TestCase((TestCase *)this,testCtx,(name->_M_dataplus)._M_p,(char *)local_50[0]);
  (this->super_TestCase).super_TestNode._vptr_TestNode = (_func_int **)&PTR__TestCase_00d33868;
  this[1].super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)*puVar2;
  *(undefined4 *)&this[1].super_TestCase.super_TestNode.m_testCtx = *(undefined4 *)(puVar2 + 1);
  *(undefined8 *)((long)&this[1].super_TestCase.super_TestNode.m_testCtx + 4) =
       *(undefined8 *)((long)puVar2 + 0xc);
  *(undefined4 *)((long)&this[1].super_TestCase.super_TestNode.m_name._M_dataplus._M_p + 4) =
       *(undefined4 *)((long)puVar2 + 0x14);
  this[1].super_TestCase.super_TestNode.m_name._M_string_length = 0x6b0000006b;
  *(undefined2 *)&this[1].super_TestCase.super_TestNode.m_name.field_2 = 0;
  this[1].super_TestCase.super_TestNode.m_name.field_2._M_local_buf[2] = '\x01';
  (__return_storage_ptr__->super_UniqueBase<vkt::TestCase,_de::DefaultDeleter<vkt::TestCase>_>).
  m_data.ptr = this;
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

de::MovePtr<TestCase> createImageQualifierRestrictCase (tcu::TestContext& testCtx, const ImageType imageType, const std::string& name)
{
	const VkFormat format = VK_FORMAT_R32G32B32A32_UINT;
	const Texture& texture = getTestTexture(imageType);
	return de::MovePtr<TestCase>(new LoadStoreTest(testCtx, name, "", texture, format, format, LoadStoreTest::FLAG_RESTRICT_IMAGES));
}